

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::DockBuilderCopyNode
               (ImGuiID src_node_id,ImGuiID dst_node_id,ImVector<unsigned_int> *out_node_remap_pairs
               )

{
  ImGuiDockNode *src_node_00;
  ImGuiDockNode *src_node;
  ImGuiContext *ctx;
  ImVector<unsigned_int> *out_node_remap_pairs_local;
  ImGuiID dst_node_id_local;
  ImGuiID src_node_id_local;
  
  if (src_node_id == 0) {
    __assert_fail("src_node_id != 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                  ,0x3963,"void ImGui::DockBuilderCopyNode(ImGuiID, ImGuiID, ImVector<ImGuiID> *)");
  }
  if (dst_node_id == 0) {
    __assert_fail("dst_node_id != 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                  ,0x3964,"void ImGui::DockBuilderCopyNode(ImGuiID, ImGuiID, ImVector<ImGuiID> *)");
  }
  if (out_node_remap_pairs == (ImVector<unsigned_int> *)0x0) {
    __assert_fail("out_node_remap_pairs != __null",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                  ,0x3965,"void ImGui::DockBuilderCopyNode(ImGuiID, ImGuiID, ImVector<ImGuiID> *)");
  }
  src_node_00 = DockContextFindNodeByID(GImGui,src_node_id);
  if (src_node_00 != (ImGuiDockNode *)0x0) {
    ImVector<unsigned_int>::clear(out_node_remap_pairs);
    DockBuilderRemoveNode(dst_node_id);
    DockBuilderCopyNodeRec(src_node_00,dst_node_id,out_node_remap_pairs);
    if (out_node_remap_pairs->Size % 2 == 0) {
      return;
    }
    __assert_fail("(out_node_remap_pairs->Size % 2) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                  ,0x396e,"void ImGui::DockBuilderCopyNode(ImGuiID, ImGuiID, ImVector<ImGuiID> *)");
  }
  __assert_fail("src_node != __null",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                ,0x3968,"void ImGui::DockBuilderCopyNode(ImGuiID, ImGuiID, ImVector<ImGuiID> *)");
}

Assistant:

void ImGui::DockBuilderCopyNode(ImGuiID src_node_id, ImGuiID dst_node_id, ImVector<ImGuiID>* out_node_remap_pairs)
{
    ImGuiContext* ctx = GImGui;
    IM_ASSERT(src_node_id != 0);
    IM_ASSERT(dst_node_id != 0);
    IM_ASSERT(out_node_remap_pairs != NULL);

    ImGuiDockNode* src_node = DockContextFindNodeByID(ctx, src_node_id);
    IM_ASSERT(src_node != NULL);

    out_node_remap_pairs->clear();
    DockBuilderRemoveNode(dst_node_id);
    DockBuilderCopyNodeRec(src_node, dst_node_id, out_node_remap_pairs);

    IM_ASSERT((out_node_remap_pairs->Size % 2) == 0);
}